

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::timeAndDate(Forth *this)

{
  tm *ptVar1;
  ForthStack<unsigned_int> *this_00;
  uint uVar2;
  time_t t;
  
  requireDStackAvailable(this,6,"TIME&DATE");
  uVar2 = 0;
  t = time((time_t *)0x0);
  ptVar1 = localtime(&t);
  if (ptVar1 == (tm *)0x0) {
    ForthStack<unsigned_int>::push(&this->dStack,0);
  }
  else {
    ForthStack<unsigned_int>::push(&this->dStack,ptVar1->tm_sec);
    uVar2 = ptVar1->tm_min;
  }
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::push(this_00,uVar2);
  if (ptVar1 == (tm *)0x0) {
    uVar2 = 1;
    ForthStack<unsigned_int>::push(this_00,0);
  }
  else {
    ForthStack<unsigned_int>::push(this_00,ptVar1->tm_hour);
    uVar2 = ptVar1->tm_mday;
  }
  ForthStack<unsigned_int>::push(this_00,uVar2);
  if (ptVar1 == (tm *)0x0) {
    ForthStack<unsigned_int>::push(this_00,1);
    uVar2 = 0;
  }
  else {
    ForthStack<unsigned_int>::push(this_00,ptVar1->tm_mon + 1);
    uVar2 = ptVar1->tm_year + 0x76c;
  }
  ForthStack<unsigned_int>::push(this_00,uVar2);
  return;
}

Assistant:

void timeAndDate() {
			REQUIRE_DSTACK_AVAILABLE(6, "TIME&DATE");
			auto t = std::time(0);
			tm *tm;
			tm=std::localtime( &t);
			
			push(static_cast<Cell>(tm?tm->tm_sec:0));
			push(static_cast<Cell>(tm ? tm->tm_min : 0));
			push(static_cast<Cell>(tm ? tm->tm_hour : 0));
			push(static_cast<Cell>(tm ? tm->tm_mday : 1));
			push(static_cast<Cell>(tm ? tm->tm_mon + 1 : 1));
			push(static_cast<Cell>(tm ? tm->tm_year + 1900 : 0));
		}